

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O1

void __thiscall intel_keym_v1_t::km_hash_t::_read(km_hash_t *this)

{
  uint16_t uVar1;
  string local_30;
  
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_hash_algorithm_id = uVar1;
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_len_hash = uVar1;
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,(ulong)uVar1);
  std::__cxx11::string::operator=((string *)&this->m_hash,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void intel_keym_v1_t::km_hash_t::_read() {
    m_hash_algorithm_id = m__io->read_u2le();
    m_len_hash = m__io->read_u2le();
    m_hash = m__io->read_bytes(len_hash());
}